

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadSplat<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  long lVar3;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  unsigned_short local_1a;
  Simd<unsigned_short,_(unsigned_char)__b_> local_18;
  
  RVar1 = Load<unsigned_short>(this,instr,&local_1a,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    lVar3 = 0;
    do {
      *(unsigned_short *)((long)local_18.v + lVar3) = local_1a;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 0x10);
    Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,local_18);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}